

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

int cs_op_index(csh ud,cs_insn *insn,uint op_type,uint post)

{
  uint local_38;
  uint local_34;
  uint i;
  uint count;
  cs_struct *handle;
  uint post_local;
  uint op_type_local;
  cs_insn *insn_local;
  csh ud_local;
  
  local_34 = 0;
  if (ud != 0) {
    if (*(int *)(ud + 0xe0) == 0) {
      *(undefined4 *)(ud + 0x58) = 7;
    }
    else if (insn->id == 0) {
      *(undefined4 *)(ud + 0x58) = 0xb;
    }
    else if (insn->detail == (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x58) = 7;
    }
    else {
      *(undefined4 *)(ud + 0x58) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        for (local_38 = 0; local_38 < (insn->detail->field_6).arm.op_count; local_38 = local_38 + 1)
        {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x28 + 0x42) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 1:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.opcode[2]; local_38 = local_38 + 1
            ) {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x30 + 0x2e) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 2:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.prefix[0]; local_38 = local_38 + 1
            ) {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x18 + 0x16) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 3:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.op_count; local_38 = local_38 + 1)
        {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x30 + 0x3e) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 4:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.addr_size; local_38 = local_38 + 1
            ) {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x10 + 0x1a) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 5:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.rex; local_38 = local_38 + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0xc + 0x1a) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 6:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.opcode[0]; local_38 = local_38 + 1
            ) {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x20 + 0x16) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      case 7:
        for (local_38 = 0; local_38 < (insn->detail->field_6).x86.prefix[0]; local_38 = local_38 + 1
            ) {
          if (*(uint *)(insn->detail->groups + (ulong)local_38 * 0x10 + 0x12) == op_type) {
            local_34 = local_34 + 1;
          }
          if (local_34 == post) {
            return local_38;
          }
        }
        break;
      default:
        *(undefined4 *)(ud + 0x58) = 3;
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

CAPSTONE_EXPORT
int cs_op_index(csh ud, const cs_insn *insn, unsigned int op_type,
		unsigned int post)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++) {
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++) {
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++) {
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++) {
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++) {
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++) {
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++) {
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++) {
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
	}

	return -1;
}